

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O1

bool __thiscall
OSSLRSA::reconstructParameters
          (OSSLRSA *this,AsymmetricParameters **ppParams,ByteString *serialisedData)

{
  int iVar1;
  size_t sVar2;
  AsymmetricParameters *pAVar3;
  
  if ((ppParams != (AsymmetricParameters **)0x0) &&
     (sVar2 = ByteString::size(serialisedData), sVar2 != 0)) {
    pAVar3 = (AsymmetricParameters *)operator_new(0x38);
    (pAVar3->super_Serialisable)._vptr_Serialisable = (_func_int **)&PTR_serialise_0019db30;
    ByteString::ByteString((ByteString *)(pAVar3 + 1));
    pAVar3[6].super_Serialisable._vptr_Serialisable = (_func_int **)0x0;
    iVar1 = (*(pAVar3->super_Serialisable)._vptr_Serialisable[4])(pAVar3,serialisedData);
    if ((char)iVar1 != '\0') {
      *ppParams = pAVar3;
      return (bool)(char)iVar1;
    }
    (*(pAVar3->super_Serialisable)._vptr_Serialisable[2])(pAVar3);
    return false;
  }
  return false;
}

Assistant:

bool OSSLRSA::reconstructParameters(AsymmetricParameters** ppParams, ByteString& serialisedData)
{
	// Check input parameters
	if ((ppParams == NULL) || (serialisedData.size() == 0))
	{
		return false;
	}

	RSAParameters* params = new RSAParameters();

	if (!params->deserialise(serialisedData))
	{
		delete params;

		return false;
	}

	*ppParams = params;

	return true;
}